

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenConstSetValueI64(BinaryenExpressionRef expr,int64_t value)

{
  bool bVar1;
  Literal local_38;
  BinaryenExpressionRef local_20;
  Expression *expression;
  int64_t value_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)value;
  value_local = (int64_t)expr;
  bVar1 = wasm::Expression::is<wasm::Const>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xac6,"void BinaryenConstSetValueI64(BinaryenExpressionRef, int64_t)");
  }
  wasm::Literal::Literal(&local_38,(int64_t)expression);
  wasm::Literal::operator=((Literal *)(local_20 + 1),&local_38);
  wasm::Literal::~Literal(&local_38);
  return;
}

Assistant:

void BinaryenConstSetValueI64(BinaryenExpressionRef expr, int64_t value) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  static_cast<Const*>(expression)->value = Literal(value);
}